

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
NominalTest_TestMaxArrayDepths_Test::TestBody(NominalTest_TestMaxArrayDepths_Test *this)

{
  allocator<wasm::HeapType> *this_00;
  initializer_list<wasm::HeapType> __l;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  mapped_type *pmVar4;
  char *in_R9;
  Entry EVar5;
  AssertHelper local_260;
  Message local_258;
  uint local_24c;
  HeapType local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_3;
  Message local_228;
  uint local_21c;
  HeapType local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  Message local_1f8;
  uint local_1ec;
  HeapType local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  uint local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  maxDepths;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_168;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> *local_160;
  size_type local_158;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_150;
  undefined1 local_138 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Type local_48;
  Field local_40;
  Array local_30;
  TypeBuilder local_20;
  TypeBuilder builder;
  HeapType A;
  NominalTest_TestMaxArrayDepths_Test *this_local;
  
  wasm::HeapType::HeapType((HeapType *)&builder);
  wasm::TypeBuilder::TypeBuilder(&local_20,1);
  wasm::Type::Type(&local_48,i32);
  wasm::Field::Field(&local_40,local_48,Immutable);
  wasm::Array::Array(&local_30,local_40);
  EVar5 = wasm::TypeBuilder::operator[](&local_20,0);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar5.builder;
  wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_30);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_98,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_98,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x407,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,0);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar3->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_20);
  if (bVar1) {
    local_168._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_160 = &local_168;
    local_158 = 1;
    this_00 = (allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7);
    std::allocator<wasm::HeapType>::allocator(this_00);
    __l._M_len = local_158;
    __l._M_array = (iterator)local_160;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_150,__l,this_00);
    wasm::SubTypes::SubTypes((SubTypes *)local_138,&local_150);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_150);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7));
    wasm::SubTypes::getMaxDepths
              ((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                *)&gtest_ar.message_,(SubTypes *)local_138);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,(key_type *)&builder);
    local_1bc = 0;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_1b8,"maxDepths[A]","Index(0)",pmVar4,&local_1bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x40f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    wasm::HeapType::HeapType(&local_1e8,array);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_1e8);
    local_1ec = 1;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_1e0,"maxDepths[HeapType::array]","Index(1)",pmVar4,&local_1ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x410,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    wasm::HeapType::HeapType(&local_218,eq);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_218);
    local_21c = 2;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_210,"maxDepths[HeapType::eq]","Index(2)",pmVar4,&local_21c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x411,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    wasm::HeapType::HeapType(&local_248,any);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_248);
    local_24c = 3;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_240,"maxDepths[HeapType::any]","Index(3)",pmVar4,&local_24c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x412,pcVar2);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    std::
    unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                      *)&gtest_ar.message_);
    wasm::SubTypes::~SubTypes((SubTypes *)local_138);
  }
  return;
}

Assistant:

TEST_F(NominalTest, TestMaxArrayDepths) {
  HeapType A;
  {
    TypeBuilder builder(1);
    builder[0] = Array(Field(Type::i32, Immutable));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
  }

  SubTypes subTypes({A});
  auto maxDepths = subTypes.getMaxDepths();

  EXPECT_EQ(maxDepths[A], Index(0));
  EXPECT_EQ(maxDepths[HeapType::array], Index(1));
  EXPECT_EQ(maxDepths[HeapType::eq], Index(2));
  EXPECT_EQ(maxDepths[HeapType::any], Index(3));
}